

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  Type pPVar1;
  Type pPVar2;
  LabelInstr *pLVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Type pPVar8;
  long lVar9;
  
  pPVar2 = (list->
           super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
           ).buffer;
  uVar5 = (list->
          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
          ).count;
  lVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  iVar6 = 1;
  while( true ) {
    if (uVar7 * 0x18 - lVar9 == 0) {
      return;
    }
    if ((*(uint *)((long)&pPVar2->first + lVar9) == item->first) &&
       (*(LabelInstr **)((long)&pPVar2->second + lVar9) == item->second)) break;
    iVar6 = iVar6 + 1;
    lVar9 = lVar9 + 0x18;
  }
  pPVar8 = pPVar2 + iVar6;
  for (; iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
    pPVar2[iVar6 + -1].initialized = pPVar8->initialized;
    uVar4 = *(undefined4 *)&pPVar8->field_0x4;
    pLVar3 = pPVar8->second;
    pPVar1 = pPVar2 + (iVar6 + -1);
    pPVar1->first = pPVar8->first;
    *(undefined4 *)&pPVar1->field_0x4 = uVar4;
    pPVar1->second = pLVar3;
    uVar5 = (list->
            super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
            ).count;
    pPVar8 = pPVar8 + 1;
  }
  iVar6 = uVar5 - 1;
  (list->
  super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
  ).count = iVar6;
  *(undefined8 *)(pPVar2 + iVar6) = 0;
  pPVar2[iVar6].second = (LabelInstr *)0x0;
  *(undefined8 *)&pPVar2[iVar6].initialized = 0;
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }